

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O3

boolean encode_mcu_AC_refine(j_compress_ptr cinfo,JBLOCKROW *MCU_data)

{
  size_t *psVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  huff_entropy_ptr_conflict entropy;
  jpeg_destination_mgr *pjVar5;
  int *piVar6;
  JBLOCKROW paJVar7;
  j_compress_ptr pjVar8;
  jpeg_error_mgr *pjVar9;
  JOCTET *pJVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  char *bufstart;
  int iVar15;
  long lVar16;
  ushort uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  int absvalues [64];
  uint auStack_138 [66];
  
  entropy = (huff_entropy_ptr_conflict)cinfo->entropy;
  pjVar5 = cinfo->dest;
  entropy->next_output_byte = pjVar5->next_output_byte;
  entropy->free_in_buffer = pjVar5->free_in_buffer;
  if ((cinfo->restart_interval != 0) && (entropy->restarts_to_go == 0)) {
    emit_restart_e(entropy,entropy->next_restart_num);
  }
  iVar18 = cinfo->Ss;
  uVar12 = cinfo->Se;
  if ((int)uVar12 < iVar18) {
    iVar14 = 0;
    bVar11 = false;
  }
  else {
    iVar14 = cinfo->Al;
    piVar6 = cinfo->natural_order;
    paJVar7 = *MCU_data;
    lVar16 = 0;
    iVar15 = 0;
    do {
      uVar3 = (*paJVar7)[piVar6[iVar18 + lVar16]];
      uVar17 = -uVar3;
      if (0 < (short)uVar3) {
        uVar17 = uVar3;
      }
      uVar19 = (uint)(uVar17 >> ((byte)iVar14 & 0x1f));
      if (uVar19 == 1) {
        iVar15 = iVar18 + (int)lVar16;
      }
      auStack_138[iVar18 + lVar16] = uVar19;
      lVar16 = lVar16 + 1;
    } while (~uVar12 + iVar18 + (int)lVar16 != 0);
    iVar14 = 0;
    bVar11 = false;
    if (iVar18 <= (int)uVar12) {
      bufstart = entropy->bit_buffer + entropy->BE;
      lVar16 = (long)iVar18;
      iVar18 = 0;
      uVar21 = 0;
      do {
        uVar19 = auStack_138[lVar16];
        if (uVar19 == 0) {
          iVar18 = iVar18 + 1;
        }
        else {
          uVar20 = uVar21;
          if ((0xf < iVar18) && (iVar14 = iVar18, lVar16 <= iVar15)) {
            do {
              emit_eobrun(entropy);
              if (entropy->gather_statistics == 0) {
                uVar4 = entropy->ac_derived_tbls[entropy->ac_tbl_no]->ehufco[0xf0];
                bVar2 = entropy->ac_derived_tbls[entropy->ac_tbl_no]->ehufsi[0xf0];
                iVar18 = (entropy->saved).put_bits;
                if (bVar2 == 0) {
                  pjVar8 = entropy->cinfo;
                  pjVar9 = pjVar8->err;
                  pjVar9->msg_code = 0x29;
                  (*pjVar9->error_exit)((j_common_ptr)pjVar8);
                  if (entropy->gather_statistics != 0) goto LAB_00116f35;
                }
                iVar18 = iVar18 + (char)bVar2;
                uVar20 = (ulong)(uVar4 & ~(uint)(-1L << (bVar2 & 0x3f))) <<
                         (0x18U - (char)iVar18 & 0x3f) | (entropy->saved).put_buffer;
                iVar13 = iVar18;
                if (7 < iVar18) {
                  do {
                    pJVar10 = entropy->next_output_byte;
                    entropy->next_output_byte = pJVar10 + 1;
                    *pJVar10 = (JOCTET)(uVar20 >> 0x10);
                    psVar1 = &entropy->free_in_buffer;
                    *psVar1 = *psVar1 - 1;
                    if (*psVar1 == 0) {
                      dump_buffer_e(entropy);
                    }
                    if ((~(uint)uVar20 & 0xff0000) == 0) {
                      pJVar10 = entropy->next_output_byte;
                      entropy->next_output_byte = pJVar10 + 1;
                      *pJVar10 = '\0';
                      psVar1 = &entropy->free_in_buffer;
                      *psVar1 = *psVar1 - 1;
                      if (*psVar1 == 0) {
                        dump_buffer_e(entropy);
                      }
                    }
                    uVar20 = uVar20 << 8;
                    iVar18 = iVar13 + -8;
                    bVar11 = 0xf < iVar13;
                    iVar13 = iVar18;
                  } while (bVar11);
                }
                (entropy->saved).put_buffer = uVar20;
                (entropy->saved).put_bits = iVar18;
              }
              else {
                entropy->ac_count_ptrs[entropy->ac_tbl_no][0xf0] =
                     entropy->ac_count_ptrs[entropy->ac_tbl_no][0xf0] + 1;
              }
LAB_00116f35:
              iVar18 = iVar14 + -0x10;
              emit_buffered_bits(entropy,bufstart,(uint)uVar21);
              bufstart = entropy->bit_buffer;
              uVar21 = 0;
              bVar11 = 0x1f < iVar14;
              uVar20 = uVar21;
              iVar14 = iVar18;
            } while (bVar11);
          }
          if ((int)uVar19 < 2) {
            emit_eobrun(entropy);
            emit_ac_symbol(entropy,entropy->ac_tbl_no,iVar18 * 0x10 + 1);
            if (entropy->gather_statistics == 0) {
              iVar18 = (entropy->saved).put_bits;
              uVar21 = (ulong)(-1 < (*paJVar7)[piVar6[lVar16]]) << (0x17U - (char)iVar18 & 0x3f) |
                       (entropy->saved).put_buffer;
              if (iVar18 < 7) {
                iVar18 = iVar18 + 1;
              }
              else {
                iVar14 = iVar18 + 9;
                do {
                  iVar18 = iVar14;
                  pJVar10 = entropy->next_output_byte;
                  entropy->next_output_byte = pJVar10 + 1;
                  *pJVar10 = (JOCTET)(uVar21 >> 0x10);
                  psVar1 = &entropy->free_in_buffer;
                  *psVar1 = *psVar1 - 1;
                  if (*psVar1 == 0) {
                    dump_buffer_e(entropy);
                  }
                  if ((~(uint)uVar21 & 0xff0000) == 0) {
                    pJVar10 = entropy->next_output_byte;
                    entropy->next_output_byte = pJVar10 + 1;
                    *pJVar10 = '\0';
                    psVar1 = &entropy->free_in_buffer;
                    *psVar1 = *psVar1 - 1;
                    if (*psVar1 == 0) {
                      dump_buffer_e(entropy);
                    }
                  }
                  uVar21 = uVar21 << 8;
                  iVar14 = iVar18 + -8;
                } while (0xf < iVar14);
                iVar18 = iVar18 + -0x10;
              }
              (entropy->saved).put_buffer = uVar21;
              (entropy->saved).put_bits = iVar18;
            }
            emit_buffered_bits(entropy,bufstart,(uint)uVar20);
            bufstart = entropy->bit_buffer;
            uVar21 = 0;
            iVar18 = 0;
          }
          else {
            uVar21 = (ulong)((uint)uVar20 + 1);
            bufstart[uVar20] = (byte)uVar19 & 1;
          }
        }
        iVar14 = (int)uVar21;
        lVar16 = lVar16 + 1;
      } while (uVar12 + 1 != (int)lVar16);
      bVar11 = 0 < iVar18;
    }
  }
  if ((bool)(iVar14 != 0 | bVar11)) {
    uVar12 = entropy->EOBRUN + 1;
    entropy->EOBRUN = uVar12;
    uVar19 = iVar14 + entropy->BE;
    entropy->BE = uVar19;
    if ((uVar12 == 0x7fff) || (0x3a9 < uVar19)) {
      emit_eobrun(entropy);
    }
  }
  pjVar5 = cinfo->dest;
  pjVar5->next_output_byte = entropy->next_output_byte;
  pjVar5->free_in_buffer = entropy->free_in_buffer;
  uVar12 = cinfo->restart_interval;
  if (uVar12 != 0) {
    uVar19 = entropy->restarts_to_go;
    if (entropy->restarts_to_go == 0) {
      entropy->next_restart_num = entropy->next_restart_num + 1U & 7;
      uVar19 = uVar12;
    }
    entropy->restarts_to_go = uVar19 - 1;
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
encode_mcu_AC_refine (j_compress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  unsigned char *st;
  int tbl, k, ke, kex;
  int v;
  const int * natural_order;

  /* Emit restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0) {
      emit_restart(cinfo, entropy->next_restart_num);
      entropy->restarts_to_go = cinfo->restart_interval;
      entropy->next_restart_num++;
      entropy->next_restart_num &= 7;
    }
    entropy->restarts_to_go--;
  }

  natural_order = cinfo->natural_order;

  /* Encode the MCU data block */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  /* Section G.1.3.3: Encoding of AC coefficients */

  /* Establish EOB (end-of-block) index */
  for (ke = cinfo->Se; ke > 0; ke--)
    /* We must apply the point transform by Al.  For AC coefficients this
     * is an integer division with rounding towards 0.  To do this portably
     * in C, we shift after obtaining the absolute value.
     */
    if ((v = (*block)[natural_order[ke]]) >= 0) {
      if (v >>= cinfo->Al) break;
    } else {
      v = -v;
      if (v >>= cinfo->Al) break;
    }

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = ke; kex > 0; kex--)
    if ((v = (*block)[natural_order[kex]]) >= 0) {
      if (v >>= cinfo->Ah) break;
    } else {
      v = -v;
      if (v >>= cinfo->Ah) break;
    }

  /* Figure G.10: Encode_AC_Coefficients_SA */
  for (k = cinfo->Ss; k <= ke; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      arith_encode(cinfo, st, 0);	/* EOB decision */
    for (;;) {
      if ((v = (*block)[natural_order[k]]) >= 0) {
	if (v >>= cinfo->Al) {
	  if (v >> 1)			/* previously nonzero coef */
	    arith_encode(cinfo, st + 2, (v & 1));
	  else {			/* newly nonzero coef */
	    arith_encode(cinfo, st + 1, 1);
	    arith_encode(cinfo, entropy->fixed_bin, 0);
	  }
	  break;
	}
      } else {
	v = -v;
	if (v >>= cinfo->Al) {
	  if (v >> 1)			/* previously nonzero coef */
	    arith_encode(cinfo, st + 2, (v & 1));
	  else {			/* newly nonzero coef */
	    arith_encode(cinfo, st + 1, 1);
	    arith_encode(cinfo, entropy->fixed_bin, 1);
	  }
	  break;
	}
      }
      arith_encode(cinfo, st + 1, 0); st += 3; k++;
    }
  }
  /* Encode EOB decision only if k <= cinfo->Se */
  if (k <= cinfo->Se) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    arith_encode(cinfo, st, 1);
  }

  return TRUE;
}